

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txindex_tests.cpp
# Opt level: O1

void __thiscall txindex_tests::txindex_initial_sync::test_method(txindex_initial_sync *this)

{
  pointer psVar1;
  element_type *peVar2;
  readonly_property65 rVar3;
  bool bVar4;
  SignalInterrupt **ppSVar5;
  CChainParams *pCVar6;
  CKey *this_00;
  iterator pvVar7;
  char *pcVar8;
  iterator pvVar9;
  iterator in_R9;
  int iVar10;
  shared_ptr<const_CTransaction> *txn;
  pointer psVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  CTransactionRef tx_disk;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> no_txns;
  CScript coinbase_script_pub_key;
  uint256 block_hash;
  TxIndex txindex;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  assertion_result local_3b0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_258;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  long *local_210;
  undefined1 local_208 [16];
  undefined1 *local_1f8;
  char **local_1f0;
  undefined1 local_1c0;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_1b8;
  undefined1 local_198 [16];
  pointer local_188;
  assertion_result local_180;
  char **local_168;
  direct_or_indirect local_138;
  uint local_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  TxIndex local_f0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  interfaces::MakeChain
            ((interfaces *)&local_210,
             &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
              super_BasicTestingSetup.m_node);
  pvVar7 = (iterator)0x0;
  TxIndex::TxIndex(&local_f0,
                   (unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>)
                   &local_210,0x100000,true,false);
  if (local_210 != (long *)0x0) {
    (**(code **)(*local_210 + 8))();
  }
  local_210 = (long *)0x0;
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x14;
  file.m_begin = (iterator)&local_220;
  msg.m_end = in_R9;
  msg.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_230,msg);
  rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)BaseIndex::Init(&local_f0.super_BaseIndex);
  local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
  local_180.m_message.px = (element_type *)0x0;
  local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = (char **)local_118;
  local_118._8_8_ = "";
  local_118._0_8_ = "txindex.Init()";
  local_208._8_8_ = local_208._8_8_ & 0xffffffffffffff00;
  local_208._0_8_ = &PTR__lazy_ostream_013abc70;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
  ;
  local_238 = "";
  pvVar7 = (iterator)0x2;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_180,(lazy_ostream *)local_208,2,0,WARN,(check_type)this,(size_t)&local_240,0x14)
  ;
  boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
  local_258._M_ptr = (element_type *)0x0;
  local_258._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_108 = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  psVar11 = (this->super_TestChain100Setup).m_coinbase_txns.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->super_TestChain100Setup).m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar11 != psVar1) {
    do {
      local_268 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
      ;
      local_260 = "";
      local_278 = &boost::unit_test::basic_cstring<char_const>::null;
      local_270 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x1b;
      file_00.m_begin = (iterator)&local_268;
      msg_00.m_end = pvVar9;
      msg_00.m_begin = pvVar7;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_278,
                 msg_00);
      bVar4 = TxIndex::FindTx(&local_f0,
                              &(((psVar11->
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                                ._M_ptr)->hash).m_wrapped,(uint256 *)local_118,
                              (CTransactionRef *)&local_258);
      local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)!bVar4;
      local_180.m_message.px = (element_type *)0x0;
      local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_138.indirect_contents.indirect = "!txindex.FindTx(txn->GetHash(), block_hash, tx_disk)";
      local_138._8_8_ = (long)"!txindex.FindTx(txn->GetHash(), block_hash, tx_disk)" + 0x34;
      local_208._8_8_ = local_208._8_8_ & 0xffffffffffffff00;
      local_208._0_8_ = &PTR__lazy_ostream_013abc70;
      local_1f8 = boost::unit_test::lazy_ostream::inst;
      local_1f0 = (char **)&local_138;
      local_288 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
      ;
      local_280 = "";
      pvVar7 = (iterator)0x1;
      pvVar9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_180,(lazy_ostream *)local_208,1,0,WARN,(check_type)this,(size_t)&local_288,
                 0x1b);
      boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
      psVar11 = psVar11 + 1;
    } while (psVar11 != psVar1);
  }
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1f;
  file_01.m_begin = (iterator)&local_298;
  msg_01.m_end = pvVar9;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2a8,
             msg_01);
  bVar4 = BaseIndex::BlockUntilSyncedToCurrentChain(&local_f0.super_BaseIndex);
  local_180.m_message.px = (element_type *)0x0;
  local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_138.indirect_contents.indirect = "!txindex.BlockUntilSyncedToCurrentChain()";
  local_138._8_8_ = (long)"!txindex.BlockUntilSyncedToCurrentChain()" + 0x29;
  local_208._8_8_ = local_208._8_8_ & 0xffffffffffffff00;
  local_208._0_8_ = &PTR__lazy_ostream_013abc70;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
  ;
  local_2b0 = "";
  pvVar7 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  local_1f0 = (char **)&local_138;
  local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar4;
  boost::test_tools::tt_detail::report_assertion
            (&local_180,(lazy_ostream *)local_208,1,0,WARN,(check_type)this,(size_t)&local_2b8,0x1f)
  ;
  boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x21;
  file_02.m_begin = (iterator)&local_2c8;
  msg_02.m_end = pvVar9;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2d8,
             msg_02);
  local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)BaseIndex::StartBackgroundSync(&local_f0.super_BaseIndex);
  local_180.m_message.px = (element_type *)0x0;
  local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_138.indirect_contents.indirect = "txindex.StartBackgroundSync()";
  local_138._8_8_ = (long)"txindex.StartBackgroundSync()" + 0x1d;
  local_208._8_8_ = local_208._8_8_ & 0xffffffffffffff00;
  local_208._0_8_ = &PTR__lazy_ostream_013abc70;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
  ;
  local_2e0 = "";
  pvVar7 = (iterator)0x0;
  local_1f0 = (char **)&local_138;
  boost::test_tools::tt_detail::report_assertion
            (&local_180,(lazy_ostream *)local_208,2,0,WARN,(check_type)this,(size_t)&local_2e8,0x21)
  ;
  boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
  pcVar8 = "m_node.shutdown";
  ppSVar5 = inline_assertion_check<true,util::SignalInterrupt*&>
                      (&(((TestChain100Setup *)&(this->super_TestChain100Setup).super_TestingSetup)
                        ->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node
                        .shutdown,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
                       ,0x24,"test_method","m_node.shutdown");
  IndexWaitSynced(&local_f0.super_BaseIndex,*ppSVar5);
  pCVar6 = Params();
  psVar11 = (pCVar6->genesis).vtx.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (pCVar6->genesis).vtx.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar11 != psVar1) {
    do {
      local_2f8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
      ;
      local_2f0 = "";
      local_308 = &boost::unit_test::basic_cstring<char_const>::null;
      local_300 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x29;
      file_03.m_begin = (iterator)&local_2f8;
      msg_03.m_end = pvVar7;
      msg_03.m_begin = pcVar8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_308,
                 msg_03);
      bVar4 = TxIndex::FindTx(&local_f0,
                              &(((psVar11->
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                                ._M_ptr)->hash).m_wrapped,(uint256 *)local_118,
                              (CTransactionRef *)&local_258);
      local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)!bVar4;
      local_180.m_message.px = (element_type *)0x0;
      local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_138.indirect_contents.indirect = "!txindex.FindTx(txn->GetHash(), block_hash, tx_disk)";
      local_138._8_8_ = (long)"!txindex.FindTx(txn->GetHash(), block_hash, tx_disk)" + 0x34;
      local_208._8_8_ = local_208._8_8_ & 0xffffffffffffff00;
      local_208._0_8_ = &PTR__lazy_ostream_013abc70;
      local_1f8 = boost::unit_test::lazy_ostream::inst;
      local_318 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
      ;
      local_310 = "";
      pcVar8 = (char *)0x1;
      pvVar7 = (iterator)0x0;
      local_1f0 = (char **)&local_138;
      boost::test_tools::tt_detail::report_assertion
                (&local_180,(lazy_ostream *)local_208,1,0,WARN,(check_type)this,(size_t)&local_318,
                 0x29);
      boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
      psVar11 = psVar11 + 1;
    } while (psVar11 != psVar1);
  }
  psVar11 = (this->super_TestChain100Setup).m_coinbase_txns.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->super_TestChain100Setup).m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar11 != psVar1) {
    do {
      bVar4 = TxIndex::FindTx(&local_f0,
                              &(((psVar11->
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                                ._M_ptr)->hash).m_wrapped,(uint256 *)local_118,
                              (CTransactionRef *)&local_258);
      if (bVar4) {
        peVar2 = (psVar11->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        auVar14[0] = -((peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0])
        ;
        auVar14[1] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 1) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1])
        ;
        auVar14[2] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 2) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2])
        ;
        auVar14[3] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 3) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3])
        ;
        auVar14[4] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 4) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4])
        ;
        auVar14[5] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 5) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5])
        ;
        auVar14[6] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 6) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6])
        ;
        auVar14[7] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 7) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7])
        ;
        auVar14[8] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 8) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8])
        ;
        auVar14[9] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 9) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9])
        ;
        auVar14[10] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                         _M_elems + 10) ==
                       ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                       [10]);
        auVar14[0xb] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 0xb) ==
                        ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0xb]);
        auVar14[0xc] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 0xc) ==
                        ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0xc]);
        auVar14[0xd] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 0xd) ==
                        ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0xd]);
        auVar14[0xe] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 0xe) ==
                        ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0xe]);
        auVar14[0xf] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 0xf) ==
                        ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0xf]);
        auVar12[0] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 0x10) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                      [0x10]);
        auVar12[1] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 0x11) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                      [0x11]);
        auVar12[2] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 0x12) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                      [0x12]);
        auVar12[3] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 0x13) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                      [0x13]);
        auVar12[4] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 0x14) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                      [0x14]);
        auVar12[5] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 0x15) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                      [0x15]);
        auVar12[6] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 0x16) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                      [0x16]);
        auVar12[7] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 0x17) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                      [0x17]);
        auVar12[8] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 0x18) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                      [0x18]);
        auVar12[9] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 0x19) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                      [0x19]);
        auVar12[10] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                         _M_elems + 0x1a) ==
                       ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                       [0x1a]);
        auVar12[0xb] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 0x1b) ==
                        ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1b]);
        auVar12[0xc] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 0x1c) ==
                        ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1c]);
        auVar12[0xd] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 0x1d) ==
                        ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1d]);
        auVar12[0xe] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 0x1e) ==
                        ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1e]);
        auVar12[0xf] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                          _M_elems + 0x1f) ==
                        ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1f]);
        auVar12 = auVar12 & auVar14;
        if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) != 0xffff) {
          local_358 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
          ;
          local_350 = "";
          local_368 = &boost::unit_test::basic_cstring<char_const>::null;
          local_360 = &boost::unit_test::basic_cstring<char_const>::null;
          file_04.m_end = (iterator)0x31;
          file_04.m_begin = (iterator)&local_358;
          msg_04.m_end = pvVar7;
          msg_04.m_begin = pcVar8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,
                     (size_t)&local_368,msg_04);
          local_180._0_8_ = local_180._0_8_ & 0xffffffffffffff00;
          local_180.m_message.px = (element_type *)0x0;
          local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_208._8_8_ = local_208._8_8_ & 0xffffffffffffff00;
          local_208._0_8_ = &PTR__lazy_ostream_013b0cb0;
          local_1f8 = boost::unit_test::lazy_ostream::inst;
          local_1f0 = (char **)0xf65817;
          local_378 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
          ;
          local_370 = "";
          pcVar8 = (char *)0x1;
          pvVar7 = (iterator)0x1;
          boost::test_tools::tt_detail::report_assertion
                    (&local_180,(lazy_ostream *)local_208,1,1,WARN,(check_type)this,
                     (size_t)&local_378,0x31);
          goto LAB_0068994c;
        }
      }
      else {
        local_328 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
        ;
        local_320 = "";
        local_338 = &boost::unit_test::basic_cstring<char_const>::null;
        local_330 = &boost::unit_test::basic_cstring<char_const>::null;
        file_05.m_end = (iterator)0x2f;
        file_05.m_begin = (iterator)&local_328;
        msg_05.m_end = pvVar7;
        msg_05.m_begin = pcVar8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_338
                   ,msg_05);
        local_180._0_8_ = local_180._0_8_ & 0xffffffffffffff00;
        local_180.m_message.px = (element_type *)0x0;
        local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_208._8_8_ = local_208._8_8_ & 0xffffffffffffff00;
        local_208._0_8_ = &PTR__lazy_ostream_013b0c70;
        local_1f8 = boost::unit_test::lazy_ostream::inst;
        local_1f0 = (char **)0xf65809;
        local_348 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
        ;
        local_340 = "";
        pcVar8 = (char *)0x1;
        pvVar7 = (iterator)0x1;
        boost::test_tools::tt_detail::report_assertion
                  (&local_180,(lazy_ostream *)local_208,1,1,WARN,(check_type)this,(size_t)&local_348
                   ,0x2f);
LAB_0068994c:
        boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
      }
      psVar11 = psVar11 + 1;
    } while (psVar11 != psVar1);
  }
  this_00 = &(this->super_TestChain100Setup).coinbaseKey;
  iVar10 = 10;
  do {
    CKey::GetPubKey((CPubKey *)&local_180,this_00);
    PKHash::PKHash((PKHash *)local_198,(CPubKey *)&local_180);
    local_1f8 = (undefined1 *)CONCAT44(local_1f8._4_4_,local_188._0_4_);
    local_208._0_8_ = local_198._0_8_;
    local_208._8_8_ = local_198._8_8_;
    local_1c0 = 2;
    GetScriptForDestination((CScript *)&local_138,(CTxDestination *)local_208);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)local_208);
    local_198 = (undefined1  [16])0x0;
    local_188 = (pointer)0x0;
    pvVar9 = (iterator)0x0;
    TestChain100Setup::CreateAndProcessBlock
              ((CBlock *)local_208,&this->super_TestChain100Setup,
               (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)local_198,
               (CScript *)&local_138,(Chainstate *)0x0);
    peVar2 = ((local_1b8.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_388 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
    ;
    local_380 = "";
    local_398 = &boost::unit_test::basic_cstring<char_const>::null;
    local_390 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x3c;
    file_06.m_begin = (iterator)&local_388;
    msg_06.m_end = pvVar7;
    msg_06.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_398,
               msg_06);
    local_3b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         BaseIndex::BlockUntilSyncedToCurrentChain(&local_f0.super_BaseIndex);
    local_3b0.m_message.px = (element_type *)0x0;
    local_3b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_3c0 = "txindex.BlockUntilSyncedToCurrentChain()";
    local_3b8 = "";
    local_180.m_message.px = (element_type *)(local_180.m_message._1_8_ << 8);
    local_180._0_8_ = &PTR__lazy_ostream_013abc70;
    local_180.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_168 = &local_3c0;
    local_3d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
    ;
    local_3c8 = "";
    pvVar9 = (iterator)0x1;
    pvVar7 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_3b0,(lazy_ostream *)&local_180,1,0,WARN,(check_type)this,(size_t)&local_3d0,
               0x3c);
    boost::detail::shared_count::~shared_count(&local_3b0.m_message.pn);
    bVar4 = TxIndex::FindTx(&local_f0,&(peVar2->hash).m_wrapped,(uint256 *)local_118,
                            (CTransactionRef *)&local_258);
    if (bVar4) {
      auVar15[0] = -((peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                    ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
      auVar15[1] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 1) ==
                    ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
      auVar15[2] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 2) ==
                    ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
      auVar15[3] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 3) ==
                    ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
      auVar15[4] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 4) ==
                    ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
      auVar15[5] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 5) ==
                    ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
      auVar15[6] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 6) ==
                    ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
      auVar15[7] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 7) ==
                    ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
      auVar15[8] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 8) ==
                    ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
      auVar15[9] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 9) ==
                    ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
      auVar15[10] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 10) ==
                     ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10])
      ;
      auVar15[0xb] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 0xb) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                      [0xb]);
      auVar15[0xc] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 0xc) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                      [0xc]);
      auVar15[0xd] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 0xd) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                      [0xd]);
      auVar15[0xe] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 0xe) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                      [0xe]);
      auVar15[0xf] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 0xf) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                      [0xf]);
      auVar13[0] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 0x10) ==
                    ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10]
                    );
      auVar13[1] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 0x11) ==
                    ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11]
                    );
      auVar13[2] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 0x12) ==
                    ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12]
                    );
      auVar13[3] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 0x13) ==
                    ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13]
                    );
      auVar13[4] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 0x14) ==
                    ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14]
                    );
      auVar13[5] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 0x15) ==
                    ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15]
                    );
      auVar13[6] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 0x16) ==
                    ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16]
                    );
      auVar13[7] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 0x17) ==
                    ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17]
                    );
      auVar13[8] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 0x18) ==
                    ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18]
                    );
      auVar13[9] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 0x19) ==
                    ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19]
                    );
      auVar13[10] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 0x1a) ==
                     ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                     [0x1a]);
      auVar13[0xb] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 0x1b) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                      [0x1b]);
      auVar13[0xc] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 0x1c) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                      [0x1c]);
      auVar13[0xd] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 0x1d) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                      [0x1d]);
      auVar13[0xe] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 0x1e) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                      [0x1e]);
      auVar13[0xf] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 0x1f) ==
                      ((local_258._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                      [0x1f]);
      auVar13 = auVar13 & auVar15;
      if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) != 0xffff) {
        local_410 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
        ;
        local_408 = "";
        local_420 = &boost::unit_test::basic_cstring<char_const>::null;
        local_418 = &boost::unit_test::basic_cstring<char_const>::null;
        file_07.m_end = (iterator)0x40;
        file_07.m_begin = (iterator)&local_410;
        msg_07.m_end = pvVar7;
        msg_07.m_begin = pvVar9;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_420
                   ,msg_07);
        local_3b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(class_property<bool>)0x0;
        local_3b0.m_message.px = (element_type *)0x0;
        local_3b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_180.m_message.px = (element_type *)(local_180.m_message._1_8_ << 8);
        local_180._0_8_ = &PTR__lazy_ostream_013b0cb0;
        local_180.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_168 = (char **)0xf65817;
        local_430 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
        ;
        local_428 = "";
        pvVar7 = (iterator)0x1;
        boost::test_tools::tt_detail::report_assertion
                  (&local_3b0,(lazy_ostream *)&local_180,1,1,WARN,(check_type)this,
                   (size_t)&local_430,0x40);
        goto LAB_00689d6d;
      }
    }
    else {
      local_3e0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
      ;
      local_3d8 = "";
      local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_08.m_end = (iterator)0x3e;
      file_08.m_begin = (iterator)&local_3e0;
      msg_08.m_end = pvVar7;
      msg_08.m_begin = pvVar9;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3f0,
                 msg_08);
      local_3b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x0;
      local_3b0.m_message.px = (element_type *)0x0;
      local_3b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_180.m_message.px = (element_type *)(local_180.m_message._1_8_ << 8);
      local_180._0_8_ = &PTR__lazy_ostream_013b0c70;
      local_180.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_168 = (char **)0xf65809;
      local_400 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
      ;
      local_3f8 = "";
      pvVar7 = (iterator)0x1;
      boost::test_tools::tt_detail::report_assertion
                (&local_3b0,(lazy_ostream *)&local_180,1,1,WARN,(check_type)this,(size_t)&local_400,
                 0x3e);
LAB_00689d6d:
      boost::detail::shared_count::~shared_count(&local_3b0.m_message.pn);
    }
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(&local_1b8);
    std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
              ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)local_198);
    if (0x1c < local_11c) {
      free(local_138.indirect_contents.indirect);
      local_138.indirect_contents.indirect = (char *)0x0;
    }
    iVar10 = iVar10 + -1;
    if (iVar10 == 0) {
      ValidationSignals::SyncWithValidationInterfaceQueue
                ((((TestChain100Setup *)&(this->super_TestChain100Setup).super_TestingSetup)->
                 super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                 validation_signals._M_t.
                 super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>
                 .super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl);
      BaseIndex::Stop(&local_f0.super_BaseIndex);
      if (local_258._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_258._M_refcount._M_pi);
      }
      TxIndex::~TxIndex(&local_f0);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

BOOST_FIXTURE_TEST_CASE(txindex_initial_sync, TestChain100Setup)
{
    TxIndex txindex(interfaces::MakeChain(m_node), 1 << 20, true);
    BOOST_REQUIRE(txindex.Init());

    CTransactionRef tx_disk;
    uint256 block_hash;

    // Transaction should not be found in the index before it is started.
    for (const auto& txn : m_coinbase_txns) {
        BOOST_CHECK(!txindex.FindTx(txn->GetHash(), block_hash, tx_disk));
    }

    // BlockUntilSyncedToCurrentChain should return false before txindex is started.
    BOOST_CHECK(!txindex.BlockUntilSyncedToCurrentChain());

    BOOST_REQUIRE(txindex.StartBackgroundSync());

    // Allow tx index to catch up with the block index.
    IndexWaitSynced(txindex, *Assert(m_node.shutdown));

    // Check that txindex excludes genesis block transactions.
    const CBlock& genesis_block = Params().GenesisBlock();
    for (const auto& txn : genesis_block.vtx) {
        BOOST_CHECK(!txindex.FindTx(txn->GetHash(), block_hash, tx_disk));
    }

    // Check that txindex has all txs that were in the chain before it started.
    for (const auto& txn : m_coinbase_txns) {
        if (!txindex.FindTx(txn->GetHash(), block_hash, tx_disk)) {
            BOOST_ERROR("FindTx failed");
        } else if (tx_disk->GetHash() != txn->GetHash()) {
            BOOST_ERROR("Read incorrect tx");
        }
    }

    // Check that new transactions in new blocks make it into the index.
    for (int i = 0; i < 10; i++) {
        CScript coinbase_script_pub_key = GetScriptForDestination(PKHash(coinbaseKey.GetPubKey()));
        std::vector<CMutableTransaction> no_txns;
        const CBlock& block = CreateAndProcessBlock(no_txns, coinbase_script_pub_key);
        const CTransaction& txn = *block.vtx[0];

        BOOST_CHECK(txindex.BlockUntilSyncedToCurrentChain());
        if (!txindex.FindTx(txn.GetHash(), block_hash, tx_disk)) {
            BOOST_ERROR("FindTx failed");
        } else if (tx_disk->GetHash() != txn.GetHash()) {
            BOOST_ERROR("Read incorrect tx");
        }
    }

    // It is not safe to stop and destroy the index until it finishes handling
    // the last BlockConnected notification. The BlockUntilSyncedToCurrentChain()
    // call above is sufficient to ensure this, but the
    // SyncWithValidationInterfaceQueue() call below is also needed to ensure
    // TSAN always sees the test thread waiting for the notification thread, and
    // avoid potential false positive reports.
    m_node.validation_signals->SyncWithValidationInterfaceQueue();

    // shutdown sequence (c.f. Shutdown() in init.cpp)
    txindex.Stop();
}